

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

char * nk_dtoa(char *s,double n)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x1aa6,"char *nk_dtoa(char *, double)");
  }
  if ((n != 0.0) || (NAN(n))) {
    dVar15 = -n;
    if (-n <= n) {
      dVar15 = n;
    }
    dVar16 = -dVar15;
    if (-dVar15 <= dVar15) {
      dVar16 = dVar15;
    }
    uVar4 = 0;
    if (9 < (int)dVar16) {
      uVar4 = 0;
      uVar8 = (int)dVar16;
      do {
        uVar4 = uVar4 + 1;
        bVar3 = 99 < uVar8;
        uVar8 = uVar8 / 10;
      } while (bVar3);
    }
    uVar8 = -uVar4;
    if (0.0 <= dVar15) {
      uVar8 = uVar4;
    }
    bVar3 = (int)uVar8 < 9;
    bVar14 = 0xffffffe9 < uVar8 - 0xe;
    pcVar5 = s;
    if (n < 0.0) {
      pcVar5 = s + 1;
      *s = '-';
    }
    uVar6 = 0;
    if (bVar14 && (bVar3 || 0.0 <= n)) {
      uVar4 = 0;
    }
    else {
      dVar16 = 1.0;
      uVar4 = ((int)uVar8 >> 0x1f) + uVar8;
      if (uVar4 != 0) {
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        uVar11 = (ulong)uVar8;
        dVar16 = 1.0;
        dVar17 = 10.0;
        do {
          if ((uVar11 & 1) != 0) {
            dVar16 = dVar16 * dVar17;
          }
          uVar8 = (uint)uVar11;
          uVar11 = uVar11 >> 1;
          dVar17 = dVar17 * dVar17;
        } while (1 < uVar8);
      }
      if ((int)uVar4 < 0) {
        dVar16 = 1.0 / dVar16;
      }
      dVar15 = dVar15 / dVar16;
      uVar8 = 0;
    }
    if (0 < (int)uVar8) {
      uVar6 = (ulong)uVar8;
    }
    do {
      iVar7 = (int)uVar6;
      dVar16 = 1.0;
      if (iVar7 != 0) {
        uVar11 = (ulong)(uint)-iVar7;
        if (0 < iVar7) {
          uVar11 = uVar6;
        }
        dVar17 = 10.0;
        dVar16 = 1.0;
        do {
          if ((uVar11 & 1) != 0) {
            dVar16 = dVar16 * dVar17;
          }
          uVar8 = (uint)uVar11;
          uVar11 = uVar11 >> 1;
          dVar17 = dVar17 * dVar17;
        } while (1 < uVar8);
      }
      if (iVar7 < 0) {
        dVar16 = 1.0 / dVar16;
      }
      if (0.0 < dVar16) {
        iVar9 = (int)(dVar15 / dVar16) - (uint)(dVar15 / dVar16 < 0.0);
        dVar15 = dVar15 - (double)iVar9 * dVar16;
        *pcVar5 = (char)iVar9 + '0';
        pcVar5 = pcVar5 + 1;
      }
      uVar6 = (ulong)(iVar7 - 1);
      if ((iVar7 == 0) && (0.0 < dVar15)) {
        *pcVar5 = '.';
        pcVar5 = pcVar5 + 1;
      }
    } while ((1e-14 < dVar15) || (0 < iVar7));
    if (!bVar14 || !bVar3 && 0.0 > n) {
      *pcVar5 = 'e';
      if ((int)uVar4 < 1) {
        pcVar5[1] = '-';
        uVar4 = -uVar4;
      }
      else {
        pcVar5[1] = '+';
      }
      pcVar5 = pcVar5 + 2;
      uVar6 = 0;
      if (0 < (int)uVar4) {
        do {
          pcVar5[uVar6] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
          uVar6 = uVar6 + 1;
          bVar3 = 9 < uVar4;
          uVar4 = uVar4 / 10;
        } while (bVar3);
        pcVar5 = pcVar5 + uVar6;
      }
      if (1 < (int)uVar6) {
        uVar6 = uVar6 & 0xffffffff;
        lVar10 = 0;
        lVar12 = 0;
        do {
          bVar13 = pcVar5[lVar12 - uVar6];
          bVar2 = pcVar5[lVar10 + -1];
          pcVar5[lVar12 - uVar6] = bVar13 ^ bVar2;
          bVar13 = bVar13 ^ bVar2 ^ pcVar5[lVar10 + -1];
          pcVar5[lVar10 + -1] = bVar13;
          pcVar5[lVar12 - uVar6] = pcVar5[lVar12 - uVar6] ^ bVar13;
          lVar12 = lVar12 + 1;
          lVar1 = (uVar6 - 2) + lVar10;
          lVar10 = lVar10 + -1;
        } while (lVar12 < lVar1);
      }
    }
  }
  else {
    *s = '0';
    pcVar5 = s + 1;
  }
  *pcVar5 = '\0';
  return s;
}

Assistant:

NK_LIB char*
nk_dtoa(char *s, double n)
{
    int useExp = 0;
    int digit = 0, m = 0, m1 = 0;
    char *c = s;
    int neg = 0;

    NK_ASSERT(s);
    if (!s) return 0;

    if (n == 0.0) {
        s[0] = '0'; s[1] = '\0';
        return s;
    }

    neg = (n < 0);
    if (neg) n = -n;

    /* calculate magnitude */
    m = nk_log10(n);
    useExp = (m >= 14 || (neg && m >= 9) || m <= -9);
    if (neg) *(c++) = '-';

    /* set up for scientific notation */
    if (useExp) {
        if (m < 0)
           m -= 1;
        n = n / (double)nk_pow(10.0, m);
        m1 = m;
        m = 0;
    }
    if (m < 1.0) {
        m = 0;
    }

    /* convert the number */
    while (n > NK_FLOAT_PRECISION || m >= 0) {
        double weight = nk_pow(10.0, m);
        if (weight > 0) {
            double t = (double)n / weight;
            digit = nk_ifloord(t);
            n -= ((double)digit * weight);
            *(c++) = (char)('0' + (char)digit);
        }
        if (m == 0 && n > 0)
            *(c++) = '.';
        m--;
    }

    if (useExp) {
        /* convert the exponent */
        int i, j;
        *(c++) = 'e';
        if (m1 > 0) {
            *(c++) = '+';
        } else {
            *(c++) = '-';
            m1 = -m1;
        }
        m = 0;
        while (m1 > 0) {
            *(c++) = (char)('0' + (char)(m1 % 10));
            m1 /= 10;
            m++;
        }
        c -= m;
        for (i = 0, j = m-1; i<j; i++, j--) {
            /* swap without temporary */
            c[i] ^= c[j];
            c[j] ^= c[i];
            c[i] ^= c[j];
        }
        c += m;
    }
    *(c) = '\0';
    return s;
}